

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderStairs<ImPlot::GetterYs<unsigned_long_long>,ImPlot::TransformerLinLog>
               (GetterYs<unsigned_long_long> *getter,TransformerLinLog *transformer,
               ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  unsigned_long_long uVar2;
  double dVar3;
  ImVec2 IVar4;
  ImPlotPlot *pIVar5;
  double dVar6;
  float fVar7;
  ImPlotContext *pIVar8;
  ImPlotContext *pIVar9;
  ImDrawList *this;
  int iVar10;
  int iVar11;
  ImPlotContext *gp;
  float fVar12;
  float fVar13;
  ImVec2 p12;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  undefined8 uStack_90;
  ImDrawList *local_80;
  ImVec2 local_78;
  undefined1 local_70 [8];
  TransformerLinLog *local_68;
  int local_60;
  ImU32 local_5c;
  float local_58;
  ImVec2 local_54;
  double local_48;
  double dStack_40;
  
  pIVar8 = GImPlot;
  pIVar5 = GImPlot->CurrentPlot;
  local_80 = DrawList;
  if (((pIVar5->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar10 = getter->Count;
    local_60 = iVar10 + -1;
    local_58 = line_weight * 0.5;
    local_98 = getter->X0;
    uStack_90._0_4_ = getter->Offset;
    uStack_90._4_4_ = getter->Stride;
    local_a8 = getter->XScale;
    dStack_a0 = getter->X0;
    uVar2 = *(unsigned_long_long *)
             ((long)getter->Ys +
             (long)((getter->Offset % iVar10 + iVar10) % iVar10) * (long)getter->Stride);
    local_70 = (undefined1  [8])getter;
    local_68 = transformer;
    local_5c = col;
    dVar6 = log10((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                  pIVar5->YAxis[transformer->YAxis].Range.Min);
    iVar10 = transformer->YAxis;
    pIVar5 = pIVar8->CurrentPlot;
    dVar3 = pIVar5->YAxis[iVar10].Range.Min;
    IVar4 = pIVar8->PixelRange[iVar10].Min;
    local_54.y = (float)(pIVar8->My[iVar10] *
                         ((dVar3 + (double)(float)(dVar6 / pIVar8->LogDenY[iVar10]) *
                                   (pIVar5->YAxis[iVar10].Range.Max - dVar3)) - dVar3) +
                        (double)IVar4.y);
    local_54.x = (float)(pIVar8->Mx * ((local_98 + local_a8 * 0.0) - (pIVar5->XAxis).Range.Min) +
                        (double)IVar4.x);
    RenderPrimitives<ImPlot::StairsRenderer<ImPlot::GetterYs<unsigned_long_long>,ImPlot::TransformerLinLog>>
              ((StairsRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::TransformerLinLog> *)
               local_70,local_80,&pIVar5->PlotRect);
  }
  else {
    local_98 = getter->X0;
    uStack_90._0_4_ = getter->Offset;
    uStack_90._4_4_ = getter->Stride;
    local_a8 = getter->XScale;
    dStack_a0 = getter->X0;
    iVar10 = getter->Count;
    uVar2 = *(unsigned_long_long *)
             ((long)getter->Ys +
             (long)((getter->Offset % iVar10 + iVar10) % iVar10) * (long)getter->Stride);
    dVar6 = log10((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                  pIVar5->YAxis[transformer->YAxis].Range.Min);
    iVar10 = transformer->YAxis;
    pIVar5 = pIVar8->CurrentPlot;
    dVar3 = pIVar5->YAxis[iVar10].Range.Min;
    IVar4 = pIVar8->PixelRange[iVar10].Min;
    local_70._4_4_ =
         (float)(pIVar8->My[iVar10] *
                 ((dVar3 + (double)(float)(dVar6 / pIVar8->LogDenY[iVar10]) *
                           (pIVar5->YAxis[iVar10].Range.Max - dVar3)) - dVar3) + (double)IVar4.y);
    local_70._0_4_ =
         (float)(pIVar8->Mx * ((local_98 + local_a8 * 0.0) - (pIVar5->XAxis).Range.Min) +
                (double)IVar4.x);
    iVar10 = getter->Count;
    if (1 < iVar10) {
      iVar11 = 1;
      do {
        pIVar9 = GImPlot;
        local_98 = getter->X0;
        uStack_90._0_4_ = getter->Offset;
        uStack_90._4_4_ = getter->Stride;
        local_a8 = (double)iVar11;
        dStack_a0 = 0.0;
        local_48 = getter->XScale;
        dStack_40 = getter->X0;
        uVar2 = *(unsigned_long_long *)
                 ((long)getter->Ys +
                 (long)(((getter->Offset + iVar11) % iVar10 + iVar10) % iVar10) *
                 (long)getter->Stride);
        dVar6 = log10((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25)
                      + ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                      GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
        this = local_80;
        iVar10 = transformer->YAxis;
        pIVar5 = pIVar9->CurrentPlot;
        dVar3 = pIVar5->YAxis[iVar10].Range.Min;
        IVar4 = pIVar9->PixelRange[iVar10].Min;
        fVar12 = (float)(pIVar9->Mx * ((local_98 + local_a8 * local_48) - (pIVar5->XAxis).Range.Min)
                        + (double)IVar4.x);
        fVar13 = (float)(pIVar9->My[iVar10] *
                         ((dVar3 + (double)(float)(dVar6 / pIVar9->LogDenY[iVar10]) *
                                   (pIVar5->YAxis[iVar10].Range.Max - dVar3)) - dVar3) +
                        (double)IVar4.y);
        local_78.y = fVar13;
        local_78.x = fVar12;
        pIVar5 = pIVar8->CurrentPlot;
        fVar7 = (float)local_70._4_4_;
        if (fVar13 <= (float)local_70._4_4_) {
          fVar7 = fVar13;
        }
        if ((fVar7 < (pIVar5->PlotRect).Max.y) &&
           (fVar7 = (float)(~-(uint)(fVar13 <= (float)local_70._4_4_) & (uint)fVar13 |
                           -(uint)(fVar13 <= (float)local_70._4_4_) & local_70._4_4_),
           pfVar1 = &(pIVar5->PlotRect).Min.y, *pfVar1 <= fVar7 && fVar7 != *pfVar1)) {
          fVar7 = (float)local_70._0_4_;
          if (fVar12 <= (float)local_70._0_4_) {
            fVar7 = fVar12;
          }
          if ((fVar7 < (pIVar5->PlotRect).Max.x) &&
             (fVar7 = (float)(-(uint)(fVar12 <= (float)local_70._0_4_) & local_70._0_4_ |
                             ~-(uint)(fVar12 <= (float)local_70._0_4_) & (uint)fVar12),
             (pIVar5->PlotRect).Min.x <= fVar7 && fVar7 != (pIVar5->PlotRect).Min.x)) {
            local_b0.y = (float)local_70._4_4_;
            local_b0.x = fVar12;
            ImDrawList::AddLine(local_80,(ImVec2 *)local_70,&local_b0,col,line_weight);
            ImDrawList::AddLine(this,&local_b0,&local_78,col,line_weight);
          }
        }
        iVar11 = iVar11 + 1;
        iVar10 = getter->Count;
        local_70 = (undefined1  [8])local_78;
      } while (iVar11 < iVar10);
    }
  }
  return;
}

Assistant:

inline void RenderStairs(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2)))) {
                ImVec2 p12(p2.x, p1.y);
                DrawList.AddLine(p1, p12, col, line_weight);
                DrawList.AddLine(p12, p2, col, line_weight);
            }
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(StairsRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}